

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stackless.hpp
# Opt level: O2

int __thiscall
stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::
executeThreads(MicrothreadManager<implementations::scheme::SchemeImplementation> *this)

{
  bool bVar1;
  _threads_iterator thread;
  uint uVar2;
  byte bVar3;
  
  thread._M_node = (this->threads)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar3 = 0;
  uVar2 = 0;
  do {
    if ((_Rb_tree_header *)thread._M_node == &(this->threads)._M_t._M_impl.super__Rb_tree_header) {
      if (bVar3 != 0) {
        (**this->_vptr_MicrothreadManager)(this);
      }
      (*this->_vptr_MicrothreadManager[1])(this,(ulong)bVar3,(ulong)uVar2);
      return uVar2;
    }
    bVar1 = Microthread<implementations::scheme::SchemeImplementation>::isResolved
                      ((Microthread<implementations::scheme::SchemeImplementation> *)
                       &thread._M_node[1]._M_parent);
    if (bVar1) {
      bVar1 = *(char *)((long)&thread._M_node[1]._M_left + 4) == '\0';
LAB_00125d08:
      bVar3 = bVar3 | bVar1;
    }
    else {
      bVar1 = isThreadScheduled(this,thread);
      if (bVar1) {
        bVar1 = executeThread(this,thread);
        uVar2 = uVar2 + bVar1;
        if (*(char *)((long)&thread._M_node[1]._M_left + 4) == '\0') {
          bVar1 = Microthread<implementations::scheme::SchemeImplementation>::isResolved
                            ((Microthread<implementations::scheme::SchemeImplementation> *)
                             &thread._M_node[1]._M_parent);
          goto LAB_00125d08;
        }
      }
    }
    thread._M_node = (_Base_ptr)std::_Rb_tree_increment(thread._M_node);
  } while( true );
}

Assistant:

int executeThreads() {
				int threads_run = 0;
				bool unwatched_resolved = false;
				for (auto it = threads.begin(); it != threads.end(); ++it) {
					if (it->second.isResolved()) {
						if(it->second.watched == false)
							unwatched_resolved = true;
						continue;
					}
					if (isThreadScheduled(it) == false) {
						continue;
					}
					if(executeThread(it))
						++threads_run;
					if (it->second.watched == false && it->second.isResolved())
						unwatched_resolved = true;
				}
				if(unwatched_resolved)
					idle();
				yield_process(unwatched_resolved, threads_run);
				return threads_run;
			}